

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O2

void __thiscall Molecules::Display(Molecules *this)

{
  ostream *poVar1;
  __node_base *p_Var2;
  string local_58;
  Molecules *local_38;
  
  p_Var2 = &(this->molecules)._M_h._M_before_begin;
  local_38 = this;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar1 = std::operator<<(poVar1,"\t");
    KeyManager::Get_abi_cxx11_(&local_58,(KeyManager *)diplo::KM,(KEY_ID)p_Var2[1]._M_nxt);
    poVar1 = std::operator<<(poVar1,(string *)&local_58);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_58);
    Molecule::Display((Molecule *)(p_Var2 + 2));
  }
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Number of molecules: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Molecules::Display() {

	for (unordered_map<KEY_ID, Molecule >::iterator it = molecules.begin(); it != molecules.end(); it++) {
			cout << it->first << "\t" << diplo::KM.Get(it->first )<< endl;
			it->second.Display();
	}

	cout << endl << "Number of molecules: " << molecules.size() << endl;
}